

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.cpp
# Opt level: O3

void __thiscall
CoreML::TreeEnsembleClassifier::setOutputClassList
          (TreeEnsembleClassifier *this,vector<long,_std::allocator<long>_> *classes)

{
  Model *pMVar1;
  long lVar2;
  TreeEnsembleClassifier *pTVar3;
  Int64Vector *pIVar4;
  pointer plVar5;
  int iVar6;
  ulong uVar7;
  
  pMVar1 = (this->super_TreeEnsembleBase).super_Model.m_spec.
           super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (pMVar1->_oneof_case_[0] == 0x192) {
    pTVar3 = (pMVar1->Type_).treeensembleclassifier_;
  }
  else {
    Specification::Model::clear_Type(pMVar1);
    pMVar1->_oneof_case_[0] = 0x192;
    pTVar3 = (TreeEnsembleClassifier *)operator_new(0x30);
    Specification::TreeEnsembleClassifier::TreeEnsembleClassifier(pTVar3);
    (pMVar1->Type_).treeensembleclassifier_ = pTVar3;
  }
  if (pTVar3->_oneof_case_[0] == 0x65) {
    pIVar4 = (pTVar3->ClassLabels_).int64classlabels_;
  }
  else {
    Specification::TreeEnsembleClassifier::clear_ClassLabels(pTVar3);
    pTVar3->_oneof_case_[0] = 0x65;
    pIVar4 = (Int64Vector *)operator_new(0x28);
    Specification::Int64Vector::Int64Vector(pIVar4);
    (pTVar3->ClassLabels_).int64classlabels_ = pIVar4;
  }
  (pIVar4->vector_).current_size_ = 0;
  if ((classes->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_finish !=
      (classes->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar7 = 0;
    do {
      pMVar1 = (this->super_TreeEnsembleBase).super_Model.m_spec.
               super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (pMVar1->_oneof_case_[0] == 0x192) {
        pTVar3 = (pMVar1->Type_).treeensembleclassifier_;
      }
      else {
        Specification::Model::clear_Type(pMVar1);
        pMVar1->_oneof_case_[0] = 0x192;
        pTVar3 = (TreeEnsembleClassifier *)operator_new(0x30);
        Specification::TreeEnsembleClassifier::TreeEnsembleClassifier(pTVar3);
        (pMVar1->Type_).treeensembleclassifier_ = pTVar3;
      }
      if (pTVar3->_oneof_case_[0] == 0x65) {
        pIVar4 = (pTVar3->ClassLabels_).int64classlabels_;
      }
      else {
        Specification::TreeEnsembleClassifier::clear_ClassLabels(pTVar3);
        pTVar3->_oneof_case_[0] = 0x65;
        pIVar4 = (Int64Vector *)operator_new(0x28);
        Specification::Int64Vector::Int64Vector(pIVar4);
        (pTVar3->ClassLabels_).int64classlabels_ = pIVar4;
      }
      plVar5 = (classes->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar2 = plVar5[uVar7];
      iVar6 = (pIVar4->vector_).current_size_;
      if (iVar6 == (pIVar4->vector_).total_size_) {
        google::protobuf::RepeatedField<long>::Reserve(&pIVar4->vector_,iVar6 + 1);
        iVar6 = (pIVar4->vector_).current_size_;
        plVar5 = (classes->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
      (pIVar4->vector_).current_size_ = iVar6 + 1;
      ((pIVar4->vector_).rep_)->elements[iVar6] = lVar2;
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)((long)(classes->super__Vector_base<long,_std::allocator<long>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)plVar5 >> 3));
  }
  return;
}

Assistant:

void TreeEnsembleClassifier::setOutputClassList(const std::vector<int64_t>& classes) {
        m_spec->mutable_treeensembleclassifier()->mutable_int64classlabels()->clear_vector();
        for(size_t i = 0; i < classes.size(); ++i) {
            m_spec->mutable_treeensembleclassifier()->mutable_int64classlabels()->add_vector(classes[i]);
        }
    }